

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O0

int ncnn::convolution(Mat *bottom_blob,Mat *top_blob,Mat *weight_data,Mat *bias_data,int kernel_w,
                     int kernel_h,int stride_w,int stride_h,int dilation_w,int dilation_h,
                     int activation_type,Mat *activation_params,Option *opt)

{
  float fVar1;
  bool bVar2;
  float *pfVar3;
  Mat *in_RCX;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  Mat *in_stack_00000030;
  float wt;
  float val;
  int k;
  float *sptr;
  Mat m;
  int q;
  float *kptr;
  float sum;
  int j_1;
  int i_1;
  float *outptr;
  int p;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int bias_term;
  int outch;
  int outh;
  int outw;
  int inch;
  int w;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  float local_1d4;
  allocator_type *in_stack_fffffffffffffe30;
  size_type in_stack_fffffffffffffe38;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe40;
  Mat *in_stack_fffffffffffffe48;
  int local_18c;
  Mat local_180;
  int local_134;
  float *local_130;
  float local_124;
  int local_120;
  int local_11c;
  Mat local_118;
  float *local_d0;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  reference local_b0;
  vector<int,_std::allocator<int>_> local_90;
  int local_74;
  uint local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  Mat *local_50;
  Mat *local_48;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  Mat *local_10;
  float local_4;
  undefined8 extraout_XMM0_Qb;
  
  local_5c = *(int *)(in_RDI + 0x2c);
  local_60 = *(int *)(in_RDI + 0x38);
  local_64 = *(int *)(in_RSI + 0x2c);
  local_68 = *(int *)(in_RSI + 0x30);
  local_6c = *(int *)(in_RSI + 0x38);
  local_58 = in_R9D;
  local_54 = in_R8D;
  local_50 = in_RCX;
  local_48 = in_RDX;
  bVar2 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
  local_70 = (uint)!bVar2;
  local_74 = local_54 * local_58;
  std::allocator<int>::allocator((allocator<int> *)0x19b9a4);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  std::allocator<int>::~allocator((allocator<int> *)0x19b9ca);
  local_b0 = std::vector<int,_std::allocator<int>_>::operator[](&local_90,0);
  local_b4 = 0;
  local_b8 = 0;
  local_bc = local_5c * in_stack_00000020 - local_54 * in_stack_00000018;
  for (local_c0 = 0; local_c0 < local_58; local_c0 = local_c0 + 1) {
    for (local_c4 = 0; local_c4 < local_54; local_c4 = local_c4 + 1) {
      local_b0[local_b4] = local_b8;
      local_b4 = local_b4 + 1;
      local_b8 = in_stack_00000018 + local_b8;
    }
    local_b8 = local_bc + local_b8;
  }
  for (local_c8 = 0; local_c8 < local_6c; local_c8 = local_c8 + 1) {
    Mat::channel(in_stack_fffffffffffffe48,(int)((ulong)in_stack_fffffffffffffe40 >> 0x20));
    pfVar3 = Mat::operator_cast_to_float_(&local_118);
    Mat::~Mat((Mat *)0x19bb5c);
    local_d0 = pfVar3;
    for (local_11c = 0; local_11c < local_68; local_11c = local_11c + 1) {
      for (local_120 = 0; local_120 < local_64; local_120 = local_120 + 1) {
        local_124 = 0.0;
        if (local_70 != 0) {
          in_stack_fffffffffffffe48 = (Mat *)Mat::operator[](local_50,(long)local_c8);
          local_124 = *(float *)&in_stack_fffffffffffffe48->data;
        }
        in_stack_fffffffffffffe40 =
             (vector<int,_std::allocator<int>_> *)Mat::operator_cast_to_float_(local_48);
        local_130 = (float *)((long)&(in_stack_fffffffffffffe40->
                                     super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                     super__Vector_impl_data._M_start +
                             (long)(local_74 * local_60 * local_c8) * 4);
        for (local_134 = 0; fVar1 = local_124, local_134 < local_60; local_134 = local_134 + 1) {
          Mat::channel(in_stack_fffffffffffffe48,(int)((ulong)in_stack_fffffffffffffe40 >> 0x20));
          pfVar3 = Mat::row(&local_180,local_11c * in_stack_00000010);
          for (local_18c = 0; local_18c < local_74; local_18c = local_18c + 1) {
            local_124 = pfVar3[(long)(local_120 * in_stack_00000008) + (long)local_b0[local_18c]] *
                        local_130[local_18c] + local_124;
          }
          local_130 = local_130 + local_74;
          Mat::~Mat((Mat *)0x19bdb8);
        }
        local_4 = local_124;
        local_10 = in_stack_00000030;
        in_stack_fffffffffffffe30 = (allocator_type *)(ulong)(in_stack_00000028 - 1);
        switch(in_stack_fffffffffffffe30) {
        case (allocator_type *)0x0:
          dVar4 = std::fmax((double)(ulong)(uint)local_124,0.0);
          local_4 = SUB84(dVar4,0);
          break;
        case (allocator_type *)0x1:
          pfVar3 = Mat::operator[](in_stack_00000030,0);
          local_14 = *pfVar3;
          if (local_4 <= 0.0) {
            local_1d4 = local_4 * local_14;
          }
          else {
            local_1d4 = local_4;
          }
          local_4 = local_1d4;
          break;
        case (allocator_type *)0x2:
          pfVar3 = Mat::operator[](in_stack_00000030,0);
          local_18 = *pfVar3;
          pfVar3 = Mat::operator[](local_10,1);
          local_1c = *pfVar3;
          if (local_4 < local_18) {
            local_4 = local_18;
          }
          if (local_1c < local_4) {
            local_4 = local_1c;
          }
          break;
        case (allocator_type *)0x3:
          dVar4 = std::exp((double)(ulong)(uint)-local_124);
          local_4 = 1.0 / (SUB84(dVar4,0) + 1.0);
          break;
        case (allocator_type *)0x4:
          auVar5._0_8_ = std::exp((double)(ulong)(uint)local_124);
          auVar5._8_8_ = extraout_XMM0_Qb;
          auVar6._4_12_ = auVar5._4_12_;
          auVar6._0_4_ = SUB84(auVar5._0_8_,0) + 1.0;
          dVar4 = std::log(auVar6._0_8_);
          dVar4 = std::tanh(dVar4);
          local_4 = fVar1 * SUB84(dVar4,0);
          break;
        case (allocator_type *)0x5:
          pfVar3 = Mat::operator[](in_stack_00000030,0);
          local_20 = *pfVar3;
          pfVar3 = Mat::operator[](local_10,1);
          local_24 = *pfVar3;
          local_28 = -local_24 / local_20;
          local_2c = 1.0 / local_20 + local_28;
          if (local_28 <= local_4) {
            if (local_4 <= local_2c) {
              local_4 = local_4 * (local_4 * local_20 + local_24);
            }
          }
          else {
            local_4 = 0.0;
          }
        }
        local_d0[local_120] = local_4;
      }
      local_d0 = local_d0 + local_64;
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe30);
  return 0;
}

Assistant:

static int convolution(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data, const Mat& bias_data, int kernel_w, int kernel_h, int stride_w, int stride_h, int dilation_w, int dilation_h, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int w = bottom_blob.w;
    const int inch = bottom_blob.c;

    const int outw = top_blob.w;
    const int outh = top_blob.h;
    const int outch = top_blob.c;

    const int bias_term = bias_data.empty() ? 0 : 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                float sum = 0.f;

                if (bias_term)
                    sum = bias_data[p];

                const float* kptr = (const float*)weight_data + maxk * inch * p;

                for (int q = 0; q < inch; q++)
                {
                    const Mat m = bottom_blob.channel(q);
                    const float* sptr = m.row(i * stride_h) + j * stride_w;

                    for (int k = 0; k < maxk; k++) // 29.23
                    {
                        float val = sptr[space_ofs[k]]; // 20.72
                        float wt = kptr[k];
                        sum += val * wt; // 41.45
                    }

                    kptr += maxk;
                }

                outptr[j] = activation_ss(sum, activation_type, activation_params);
            }

            outptr += outw;
        }
    }

    return 0;
}